

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeLocation.cpp
# Opt level: O0

XMLCh * xercesc_4_0::allocate(XMLCh *href)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLSize_t length;
  XMLCh *allocated;
  XMLCh *href_local;
  XMLCh *target;
  
  XVar2 = XMLString::stringLen(href);
  iVar1 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                    (XMLPlatformUtils::fgMemoryManager,(XVar2 + 1) * 2);
  target = (XMLCh *)CONCAT44(extraout_var,iVar1);
  XMLString::copyString(target,href);
  XMLPlatformUtils::removeDotDotSlash(target,XMLPlatformUtils::fgMemoryManager);
  return target;
}

Assistant:

const XMLCh *allocate(const XMLCh *href){
    XMLCh *allocated;
    XMLSize_t length = XMLString::stringLen(href);
    allocated = (XMLCh*)XMLPlatformUtils::fgMemoryManager->allocate((length+1) * sizeof(XMLCh));
    XMLString::copyString(allocated, href);
    XMLPlatformUtils::removeDotDotSlash(allocated);

    return allocated;
}